

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>
::_insert_boundary(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>
                   *this,Index currentIndex)

{
  Index *pIVar1;
  pointer pIVar2;
  undefined1 *puVar3;
  node_ptr plVar4;
  uint uVar5;
  Column_support *pCVar6;
  Index local_2c;
  initializer_list<unsigned_int> local_28;
  
  local_28._M_array = &local_2c;
  local_28._M_len = 1;
  local_2c = currentIndex;
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false>>>
  ::_insert<std::initializer_list<unsigned_int>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false>>>
              *)&this->mirrorMatrixU_,&local_28,(this->mirrorMatrixU_).nextInsertIndex_,0);
  pIVar1 = &(this->mirrorMatrixU_).nextInsertIndex_;
  *pIVar1 = *pIVar1 + 1;
  if ((this->reducedMatrixR_).
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_false>_>_>_>
      .rowSwapped_ == true) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>_>
    ::_orderRows(&(this->reducedMatrixR_).
                  super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_false>_>_>_>
                );
  }
  pIVar2 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar6 = &pIVar2[currentIndex].column_;
  puVar3 = *(undefined1 **)&(pCVar6->super_type).data_.root_plus_size_;
  uVar5 = 0xffffffff;
  if ((Column_support *)puVar3 != pCVar6 && puVar3 != (undefined1 *)0x0) {
    plVar4 = *(node_ptr *)((long)&pIVar2[currentIndex].column_.super_type.data_ + 8);
    if (plVar4 == (node_ptr)0x0) {
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, true, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, true, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, true, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, true, false>>::Matrix_column_tag, Type = 1]"
                   );
    }
    uVar5 = *(uint *)&plVar4[1].next_;
  }
  if ((uVar5 != 0xffffffff) &&
     ((ulong)((long)(this->pivotToColumnIndex_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->pivotToColumnIndex_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) <= (ulong)uVar5)) {
    local_28._M_array = (iterator)CONCAT44(local_28._M_array._4_4_,0xffffffff);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->pivotToColumnIndex_,(ulong)(uVar5 * 2 + 2),(value_type_conflict1 *)&local_28);
  }
  if ((this->reducedMatrixR_).
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_false>_>_>_>
      .rowSwapped_ == true) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>_>
    ::_orderRows(&(this->reducedMatrixR_).
                  super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_false>_>_>_>
                );
  }
  pCVar6 = &(this->reducedMatrixR_).matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[currentIndex].column_;
  puVar3 = *(undefined1 **)&(pCVar6->super_type).data_.root_plus_size_;
  if ((Column_support *)puVar3 != pCVar6 && puVar3 != (undefined1 *)0x0) {
    _reduce_column(this,currentIndex,this->nextEventIndex_);
  }
  this->nextEventIndex_ = this->nextEventIndex_ + 1;
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_insert_boundary(Index currentIndex)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    mirrorMatrixU_.insert_column({currentIndex});
  } else {
    mirrorMatrixU_.insert_column({{currentIndex, 1}});
  }

  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    ID_index pivot = reducedMatrixR_.get_column(currentIndex).get_pivot();
    if (pivot != Master_matrix::template get_null_value<ID_index>() && pivotToColumnIndex_.size() <= pivot)
      pivotToColumnIndex_.resize((pivot + 1) * 2, Master_matrix::template get_null_value<Index>());
  }

  _reduce_last_column(currentIndex);
  ++nextEventIndex_;
}